

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_update_camera3d(rf_camera3d *camera,rf_camera3d_state *state,
                       rf_input_state_for_update_camera input_state)

{
  float *pfVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  long local_40;
  rf_int i;
  byte local_30;
  byte local_2f;
  _Bool is_moving;
  _Bool direction [6];
  _Bool szoom_key;
  _Bool alt_key;
  _Bool pan_key;
  int mouse_wheel_move;
  rf_vec2 mouse_position;
  rf_vec2 mouse_position_delta;
  rf_camera3d_state *state_local;
  rf_camera3d *camera_local;
  
  memset(&mouse_position,0,8);
  direction._1_4_ = input_state.mouse_wheel_move;
  direction[0] = (_Bool)(input_state.is_camera_pan_control_key_down & 1);
  is_moving = (_Bool)(input_state.is_camera_alt_control_key_down & 1);
  local_2f = input_state.is_camera_smooth_zoom_control_key & 1;
  i._3_1_ = input_state.direction_keys[0] & 1;
  i._4_1_ = input_state.direction_keys[1] & 1;
  i._5_1_ = input_state.direction_keys[2] & 1;
  i._6_1_ = input_state.direction_keys[3] & 1;
  i._7_1_ = input_state.direction_keys[4] & 1;
  local_30 = input_state.direction_keys[5] & 1;
  if (state->camera_mode != RF_CAMERA_CUSTOM) {
    stack0xffffffffffffffd8 = input_state.mouse_position.x;
    mouse_position.x = stack0xffffffffffffffd8 - (state->previous_mouse_position).x;
    mouse_wheel_move = input_state.mouse_position.y;
    mouse_position.y = (float)mouse_wheel_move - (state->previous_mouse_position).y;
    state->previous_mouse_position = input_state.mouse_position;
  }
  unique0x10002d14 = input_state.mouse_position;
  switch(state->camera_mode) {
  case RF_CAMERA_FREE:
    if ((120.0 < state->camera_target_distance || state->camera_target_distance == 120.0) ||
       (-1 < input_state.mouse_wheel_move)) {
      fVar7 = (camera->position).y;
      pfVar1 = &(camera->target).y;
      if ((fVar7 < *pfVar1 || fVar7 == *pfVar1) ||
         (((state->camera_target_distance != 120.0 || (NAN(state->camera_target_distance))) ||
          (-1 < input_state.mouse_wheel_move)))) {
        fVar7 = (camera->position).y;
        pfVar1 = &(camera->target).y;
        if ((fVar7 < *pfVar1 || fVar7 == *pfVar1) || ((camera->target).y < 0.0)) {
          fVar7 = (camera->position).y;
          pfVar1 = &(camera->target).y;
          if ((fVar7 < *pfVar1 || fVar7 == *pfVar1) ||
             ((pfVar1 = &(camera->target).y, 0.0 < *pfVar1 || *pfVar1 == 0.0 ||
              (input_state.mouse_wheel_move < 1)))) {
            if (((camera->target).y <= (camera->position).y) ||
               (((state->camera_target_distance != 120.0 || (NAN(state->camera_target_distance))) ||
                (-1 < input_state.mouse_wheel_move)))) {
              if (((camera->target).y <= (camera->position).y) || (0.0 < (camera->target).y)) {
                if (((camera->position).y < (camera->target).y) &&
                   (((0.0 < (camera->target).y && (0 < input_state.mouse_wheel_move)) &&
                    (state->camera_target_distance =
                          -(float)input_state.mouse_wheel_move * 1.5 + state->camera_target_distance
                    , state->camera_target_distance <= 0.3 && state->camera_target_distance != 0.3))
                   )) {
                  state->camera_target_distance = 0.3;
                }
              }
              else {
                (camera->target).x =
                     ((float)input_state.mouse_wheel_move *
                      ((camera->target).x - (camera->position).x) * 1.5) /
                     state->camera_target_distance + (camera->target).x;
                (camera->target).y =
                     ((float)input_state.mouse_wheel_move *
                      ((camera->target).y - (camera->position).y) * 1.5) /
                     state->camera_target_distance + (camera->target).y;
                (camera->target).z =
                     ((float)input_state.mouse_wheel_move *
                      ((camera->target).z - (camera->position).z) * 1.5) /
                     state->camera_target_distance + (camera->target).z;
              }
            }
            else {
              (camera->target).x =
                   ((float)input_state.mouse_wheel_move *
                    ((camera->target).x - (camera->position).x) * 1.5) /
                   state->camera_target_distance + (camera->target).x;
              (camera->target).y =
                   ((float)input_state.mouse_wheel_move *
                    ((camera->target).y - (camera->position).y) * 1.5) /
                   state->camera_target_distance + (camera->target).y;
              (camera->target).z =
                   ((float)input_state.mouse_wheel_move *
                    ((camera->target).z - (camera->position).z) * 1.5) /
                   state->camera_target_distance + (camera->target).z;
            }
          }
          else {
            state->camera_target_distance =
                 -(float)input_state.mouse_wheel_move * 1.5 + state->camera_target_distance;
            if (state->camera_target_distance <= 0.3 && state->camera_target_distance != 0.3) {
              state->camera_target_distance = 0.3;
            }
          }
        }
        else {
          (camera->target).x =
               ((float)input_state.mouse_wheel_move * ((camera->target).x - (camera->position).x) *
               1.5) / state->camera_target_distance + (camera->target).x;
          (camera->target).y =
               ((float)input_state.mouse_wheel_move * ((camera->target).y - (camera->position).y) *
               1.5) / state->camera_target_distance + (camera->target).y;
          (camera->target).z =
               ((float)input_state.mouse_wheel_move * ((camera->target).z - (camera->position).z) *
               1.5) / state->camera_target_distance + (camera->target).z;
        }
      }
      else {
        (camera->target).x =
             ((float)input_state.mouse_wheel_move * ((camera->target).x - (camera->position).x) *
             1.5) / state->camera_target_distance + (camera->target).x;
        (camera->target).y =
             ((float)input_state.mouse_wheel_move * ((camera->target).y - (camera->position).y) *
             1.5) / state->camera_target_distance + (camera->target).y;
        (camera->target).z =
             ((float)input_state.mouse_wheel_move * ((camera->target).z - (camera->position).z) *
             1.5) / state->camera_target_distance + (camera->target).z;
      }
    }
    else {
      state->camera_target_distance =
           -(float)input_state.mouse_wheel_move * 1.5 + state->camera_target_distance;
      if (120.0 < state->camera_target_distance) {
        state->camera_target_distance = 120.0;
      }
    }
    if (((undefined1  [24])input_state & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      if (((undefined1  [24])input_state & (undefined1  [24])0x10000000000) == (undefined1  [24])0x0
         ) {
        fVar7 = mouse_position.x * -0.01;
        fVar8 = cosf((state->camera_angle).x);
        fVar9 = mouse_position.y * 0.01;
        fVar10 = sinf((state->camera_angle).x);
        fVar6 = sinf((state->camera_angle).y);
        (camera->target).x =
             (fVar7 * fVar8 + fVar9 * fVar10 * fVar6) * (state->camera_target_distance / 5.1) +
             (camera->target).x;
        fVar7 = mouse_position.y * 0.01;
        fVar8 = cosf((state->camera_angle).y);
        (camera->target).y =
             fVar7 * fVar8 * (state->camera_target_distance / 5.1) + (camera->target).y;
        fVar7 = mouse_position.x * 0.01;
        fVar8 = sinf((state->camera_angle).x);
        fVar9 = mouse_position.y * 0.01;
        fVar10 = cosf((state->camera_angle).x);
        fVar6 = sinf((state->camera_angle).y);
        (camera->target).z =
             (fVar7 * fVar8 + fVar9 * fVar10 * fVar6) * (state->camera_target_distance / 5.1) +
             (camera->target).z;
      }
      else if (((undefined1  [24])input_state & (undefined1  [24])0x1000000000000) ==
               (undefined1  [24])0x0) {
        (state->camera_angle).x = mouse_position.x * -0.01 + (state->camera_angle).x;
        (state->camera_angle).y = mouse_position.y * -0.01 + (state->camera_angle).y;
        if ((state->camera_angle).y <= 1.4835298) {
          pfVar1 = &(state->camera_angle).y;
          if (*pfVar1 <= -1.4835298 && *pfVar1 != -1.4835298) {
            (state->camera_angle).y = -1.4835298;
          }
        }
        else {
          (state->camera_angle).y = 1.4835298;
        }
      }
      else {
        state->camera_target_distance = mouse_position.y * 0.05 + state->camera_target_distance;
      }
    }
    fVar8 = sinf((state->camera_angle).x);
    fVar7 = state->camera_target_distance;
    fVar9 = cosf((state->camera_angle).y);
    (camera->position).x = fVar8 * fVar7 * fVar9 + (camera->target).x;
    iVar5 = -1;
    if ((state->camera_angle).y <= 0.0) {
      iVar5 = 1;
    }
    fVar8 = sinf((state->camera_angle).y);
    fVar7 = state->camera_target_distance;
    fVar9 = sinf((state->camera_angle).y);
    (camera->position).y = (float)iVar5 * fVar8 * fVar7 * fVar9 + (camera->target).y;
    fVar8 = cosf((state->camera_angle).x);
    fVar7 = state->camera_target_distance;
    fVar9 = cosf((state->camera_angle).y);
    (camera->position).z = fVar8 * fVar7 * fVar9 + (camera->target).z;
    break;
  case RF_CAMERA_ORBITAL:
    (state->camera_angle).x = (state->camera_angle).x + 0.01;
    state->camera_target_distance =
         -(float)input_state.mouse_wheel_move * 1.5 + state->camera_target_distance;
    if (state->camera_target_distance <= 1.2 && state->camera_target_distance != 1.2) {
      state->camera_target_distance = 1.2;
    }
    fVar8 = sinf((state->camera_angle).x);
    fVar7 = state->camera_target_distance;
    fVar9 = cosf((state->camera_angle).y);
    (camera->position).x = fVar8 * fVar7 * fVar9 + (camera->target).x;
    iVar5 = -1;
    if ((state->camera_angle).y <= 0.0) {
      iVar5 = 1;
    }
    fVar8 = sinf((state->camera_angle).y);
    fVar7 = state->camera_target_distance;
    fVar9 = sinf((state->camera_angle).y);
    (camera->position).y = (float)iVar5 * fVar8 * fVar7 * fVar9 + (camera->target).y;
    fVar8 = cosf((state->camera_angle).x);
    fVar7 = state->camera_target_distance;
    fVar9 = cosf((state->camera_angle).y);
    (camera->position).z = fVar8 * fVar7 * fVar9 + (camera->target).z;
    break;
  case RF_CAMERA_FIRST_PERSON:
    fVar7 = sinf((state->camera_angle).x);
    bVar2 = i._4_1_ & 1;
    fVar8 = sinf((state->camera_angle).x);
    bVar3 = i._3_1_ & 1;
    fVar9 = cosf((state->camera_angle).x);
    bVar4 = i._6_1_ & 1;
    fVar10 = cosf((state->camera_angle).x);
    (camera->position).x =
         (fVar10 * (float)(i._5_1_ & 1) +
         -fVar9 * (float)bVar4 + fVar7 * (float)bVar2 + -(fVar8 * (float)bVar3)) / 20.0 +
         (camera->position).x;
    fVar7 = sinf((state->camera_angle).y);
    bVar2 = i._3_1_ & 1;
    fVar8 = sinf((state->camera_angle).y);
    (camera->position).y =
         (((float)(i._7_1_ & 1) + fVar7 * (float)bVar2 + -(fVar8 * (float)(i._4_1_ & 1))) -
         (float)(local_30 & 1)) / 20.0 + (camera->position).y;
    fVar7 = cosf((state->camera_angle).x);
    bVar2 = i._4_1_ & 1;
    fVar8 = cosf((state->camera_angle).x);
    bVar3 = i._3_1_ & 1;
    fVar9 = sinf((state->camera_angle).x);
    bVar4 = i._6_1_ & 1;
    fVar10 = sinf((state->camera_angle).x);
    (camera->position).z =
         (-fVar10 * (float)(i._5_1_ & 1) +
         fVar9 * (float)bVar4 + fVar7 * (float)bVar2 + -(fVar8 * (float)bVar3)) / 20.0 +
         (camera->position).z;
    i._2_1_ = 0;
    for (local_40 = 0; local_40 < 6; local_40 = local_40 + 1) {
      if ((*(byte *)((long)&i + local_40 + 3) & 1) != 0) {
        i._2_1_ = 1;
        break;
      }
    }
    (state->camera_angle).x = mouse_position.x * -0.003 + (state->camera_angle).x;
    (state->camera_angle).y = mouse_position.y * -0.003 + (state->camera_angle).y;
    if ((state->camera_angle).y <= 1.4835298) {
      pfVar1 = &(state->camera_angle).y;
      if (*pfVar1 <= -1.4835298 && *pfVar1 != -1.4835298) {
        (state->camera_angle).y = -1.4835298;
      }
    }
    else {
      (state->camera_angle).y = 1.4835298;
    }
    fVar7 = (camera->position).x;
    fVar8 = sinf((state->camera_angle).x);
    (camera->target).x = -fVar8 * 25.0 + fVar7;
    fVar7 = (camera->position).y;
    fVar8 = sinf((state->camera_angle).y);
    (camera->target).y = fVar8 * 25.0 + fVar7;
    fVar7 = (camera->position).z;
    fVar8 = cosf((state->camera_angle).x);
    (camera->target).z = -fVar8 * 25.0 + fVar7;
    if ((i._2_1_ & 1) != 0) {
      state->swing_counter = state->swing_counter + 1;
    }
    fVar7 = state->player_eyes_position;
    fVar8 = sinf((float)state->swing_counter / 5.0);
    (camera->position).y = fVar7 - fVar8 / 30.0;
    fVar7 = sinf((float)state->swing_counter / 10.0);
    (camera->up).x = fVar7 / 200.0;
    fVar7 = sinf((float)state->swing_counter / 10.0);
    (camera->up).z = -fVar7 / 200.0;
    break;
  case RF_CAMERA_THIRD_PERSON:
    fVar7 = sinf((state->camera_angle).x);
    bVar2 = i._4_1_ & 1;
    fVar8 = sinf((state->camera_angle).x);
    bVar3 = i._3_1_ & 1;
    fVar9 = cosf((state->camera_angle).x);
    bVar4 = i._6_1_ & 1;
    fVar10 = cosf((state->camera_angle).x);
    (camera->position).x =
         (fVar10 * (float)(i._5_1_ & 1) +
         -fVar9 * (float)bVar4 + fVar7 * (float)bVar2 + -(fVar8 * (float)bVar3)) / 20.0 +
         (camera->position).x;
    fVar7 = sinf((state->camera_angle).y);
    bVar2 = i._3_1_ & 1;
    fVar8 = sinf((state->camera_angle).y);
    (camera->position).y =
         (((float)(i._7_1_ & 1) + fVar7 * (float)bVar2 + -(fVar8 * (float)(i._4_1_ & 1))) -
         (float)(local_30 & 1)) / 20.0 + (camera->position).y;
    fVar7 = cosf((state->camera_angle).x);
    bVar2 = i._4_1_ & 1;
    fVar8 = cosf((state->camera_angle).x);
    bVar3 = i._3_1_ & 1;
    fVar9 = sinf((state->camera_angle).x);
    bVar4 = i._6_1_ & 1;
    fVar10 = sinf((state->camera_angle).x);
    (camera->position).z =
         (-fVar10 * (float)(i._5_1_ & 1) +
         fVar9 * (float)bVar4 + fVar7 * (float)bVar2 + -(fVar8 * (float)bVar3)) / 20.0 +
         (camera->position).z;
    (state->camera_angle).x = mouse_position.x * -0.003 + (state->camera_angle).x;
    (state->camera_angle).y = mouse_position.y * -0.003 + (state->camera_angle).y;
    if ((state->camera_angle).y <= 0.08726646) {
      pfVar1 = &(state->camera_angle).y;
      if (*pfVar1 <= -1.4835298 && *pfVar1 != -1.4835298) {
        (state->camera_angle).y = -1.4835298;
      }
    }
    else {
      (state->camera_angle).y = 0.08726646;
    }
    state->camera_target_distance =
         -(float)(int)direction._1_4_ * 1.5 + state->camera_target_distance;
    if (state->camera_target_distance <= 1.2 && state->camera_target_distance != 1.2) {
      state->camera_target_distance = 1.2;
    }
    fVar8 = sinf((state->camera_angle).x);
    fVar7 = state->camera_target_distance;
    fVar9 = cosf((state->camera_angle).y);
    (camera->position).x = fVar8 * fVar7 * fVar9 + (camera->target).x;
    if (0.0 < (state->camera_angle).y) {
      fVar8 = sinf((state->camera_angle).y);
      fVar7 = state->camera_target_distance;
      fVar9 = sinf((state->camera_angle).y);
      (camera->position).y = -fVar8 * fVar7 * fVar9 + (camera->target).y;
    }
    else {
      fVar8 = sinf((state->camera_angle).y);
      fVar7 = state->camera_target_distance;
      fVar9 = sinf((state->camera_angle).y);
      (camera->position).y = fVar8 * fVar7 * fVar9 + (camera->target).y;
    }
    fVar8 = cosf((state->camera_angle).x);
    fVar7 = state->camera_target_distance;
    fVar9 = cosf((state->camera_angle).y);
    (camera->position).z = fVar8 * fVar7 * fVar9 + (camera->target).z;
  }
  return;
}

Assistant:

RF_API void rf_update_camera3d(rf_camera3d* camera, rf_camera3d_state* state, rf_input_state_for_update_camera input_state)
{
    // rf_camera3d mouse movement sensitivity
    #define RF_CAMERA_MOUSE_MOVE_SENSITIVITY 0.003f
    #define RF_CAMERA_MOUSE_SCROLL_SENSITIVITY 1.5f

    // FREE_CAMERA
    #define RF_CAMERA_FREE_MOUSE_SENSITIVITY 0.01f
    #define RF_CAMERA_FREE_DISTANCE_MIN_CLAMP 0.3f
    #define RF_CAMERA_FREE_DISTANCE_MAX_CLAMP 120.0f
    #define RF_CAMERA_FREE_MIN_CLAMP 85.0f
    #define RF_CAMERA_FREE_MAX_CLAMP -85.0f
    #define RF_CAMERA_FREE_SMOOTH_ZOOM_SENSITIVITY 0.05f
    #define RF_CAMERA_FREE_PANNING_DIVIDER 5.1f

    // ORBITAL_CAMERA
    #define RF_CAMERA_ORBITAL_SPEED 0.01f // Radians per frame

    // FIRST_PERSON
    //#define CAMERA_FIRST_PERSON_MOUSE_SENSITIVITY           0.003f
    #define RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE 25.0f
    #define RF_CAMERA_FIRST_PERSON_MIN_CLAMP 85.0f
    #define RF_CAMERA_FIRST_PERSON_MAX_CLAMP -85.0f

    #define RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER 5.0f
    #define RF_CAMERA_FIRST_PERSON_STEP_DIVIDER 30.0f
    #define RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER 200.0f

    // THIRD_PERSON
    //#define CAMERA_THIRD_PERSON_MOUSE_SENSITIVITY           0.003f
    #define RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP 1.2f
    #define RF_CAMERA_THIRD_PERSON_MIN_CLAMP 5.0f
    #define RF_CAMERA_THIRD_PERSON_MAX_CLAMP -85.0f
    #define RF_CAMERA_THIRD_PERSON_OFFSET (rf_vec3) { 0.4f, 0.0f, 0.0f }

    // PLAYER (used by camera)
    #define RF_PLAYER_MOVEMENT_SENSITIVITY 20.0f

    // rf_camera3d move modes (first person and third person cameras)
    typedef enum rf_camera_move
    {
        rf_move_front = 0,
        rf_move_back,
        rf_move_right,
        rf_move_left,
        rf_move_up,
        rf_move_down
    } rf_camera_move;

    // RF_INTERNAL float player_eyes_position = 1.85f;

    // TODO: CRF_INTERNAL rf_ctx->gl_ctx.camera_target_distance and rf_ctx->gl_ctx.camera_angle here

    // Mouse movement detection
    rf_vec2 mouse_position_delta = { 0.0f, 0.0f };
    rf_vec2 mouse_position = input_state.mouse_position;
    int mouse_wheel_move = input_state.mouse_wheel_move;

    // Keys input detection
    bool pan_key = input_state.is_camera_pan_control_key_down;
    bool alt_key = input_state.is_camera_alt_control_key_down;
    bool szoom_key = input_state.is_camera_smooth_zoom_control_key;

    bool direction[6];
    direction[0] = input_state.direction_keys[0];
    direction[1] = input_state.direction_keys[1];
    direction[2] = input_state.direction_keys[2];
    direction[3] = input_state.direction_keys[3];
    direction[4] = input_state.direction_keys[4];
    direction[5] = input_state.direction_keys[5];

    // TODO: Consider touch inputs for camera

    if (state->camera_mode != RF_CAMERA_CUSTOM)
    {
        mouse_position_delta.x = mouse_position.x - state->previous_mouse_position.x;
        mouse_position_delta.y = mouse_position.y - state->previous_mouse_position.y;

        state->previous_mouse_position = mouse_position;
    }

    // Support for multiple automatic camera modes
    switch (state->camera_mode)
    {
        case RF_CAMERA_FREE:
        {
            // Camera zoom
            if ((state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);

                if (state->camera_target_distance > RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MAX_CLAMP;
                }
            }
            // Camera looking down
            // TODO: Review, weird comparisson of rf_ctx->gl_ctx.camera_target_distance == 120.0f?
            else if ((camera->position.y > camera->target.y) && (state->camera_target_distance == RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
            }
            else if ((camera->position.y > camera->target.y) && (camera->target.y >= 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;

                // if (camera->target.y < 0) camera->target.y = -0.001;
            }
            else if ((camera->position.y > camera->target.y) && (camera->target.y < 0) && (mouse_wheel_move > 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);
                if (state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MIN_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MIN_CLAMP;
                }
            }
            // Camera looking up
            // TODO: Review, weird comparisson of rf_ctx->gl_ctx.camera_target_distance == 120.0f?
            else if ((camera->position.y < camera->target.y) && (state->camera_target_distance == RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
            }
            else if ((camera->position.y < camera->target.y) && (camera->target.y <= 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;

                // if (camera->target.y > 0) camera->target.y = 0.001;
            }
            else if ((camera->position.y < camera->target.y) && (camera->target.y > 0) && (mouse_wheel_move > 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);
                if (state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MIN_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MIN_CLAMP;
                }
            }

            // Input keys checks
            if (pan_key)
            {
                if (alt_key) // Alternative key behaviour
                {
                    if (szoom_key)
                    {
                        // Camera smooth zoom
                        state->camera_target_distance += (mouse_position_delta.y * RF_CAMERA_FREE_SMOOTH_ZOOM_SENSITIVITY);
                    }
                    else
                    {
                        // Camera rotation
                        state->camera_angle.x += mouse_position_delta.x*-RF_CAMERA_FREE_MOUSE_SENSITIVITY;
                        state->camera_angle.y += mouse_position_delta.y*-RF_CAMERA_FREE_MOUSE_SENSITIVITY;

                        // Angle clamp
                        if (state->camera_angle.y > RF_CAMERA_FREE_MIN_CLAMP * RF_DEG2RAD) {
                            state->camera_angle.y = RF_CAMERA_FREE_MIN_CLAMP * RF_DEG2RAD;
                        }
                        else if (state->camera_angle.y < RF_CAMERA_FREE_MAX_CLAMP * RF_DEG2RAD) {
                            state->camera_angle.y = RF_CAMERA_FREE_MAX_CLAMP * RF_DEG2RAD;
                        }
                    }
                }
                else
                {
                    // Camera panning
                    camera->target.x += ((mouse_position_delta.x*-RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.x) + (mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * sinf(state->camera_angle.x) * sinf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                    camera->target.y += ((mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                    camera->target.z += ((mouse_position_delta.x * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * sinf(state->camera_angle.x) + (mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.x) * sinf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                }
            }

            // Update camera position with changes
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;
            camera->position.y = ((state->camera_angle.y <= 0.0f)? 1 : -1)*sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        case RF_CAMERA_ORBITAL:
        {
            state->camera_angle.x += RF_CAMERA_ORBITAL_SPEED; // Camera orbit angle
            state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY); // Camera zoom

            // Camera distance clamp
            if (state->camera_target_distance < RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP) {
                state->camera_target_distance = RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP;
            }

            // Update camera position with changes
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;
            camera->position.y = ((state->camera_angle.y <= 0.0f)? 1 : -1)*sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        case RF_CAMERA_FIRST_PERSON:
        {
            camera->position.x += (sinf(state->camera_angle.x)*direction[rf_move_back] -
                                   sinf(state->camera_angle.x)*direction[rf_move_front] -
                                   cosf(state->camera_angle.x)*direction[rf_move_left] +
                                   cosf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.y += (sinf(state->camera_angle.y)*direction[rf_move_front] -
                                   sinf(state->camera_angle.y)*direction[rf_move_back] +
                                   1.0f*direction[rf_move_up] - 1.0f*direction[rf_move_down]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.z += (cosf(state->camera_angle.x)*direction[rf_move_back] -
                                   cosf(state->camera_angle.x)*direction[rf_move_front] +
                                   sinf(state->camera_angle.x)*direction[rf_move_left] -
                                   sinf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            bool is_moving = false; // Required for swinging

            for (rf_int i = 0; i < 6; i++) if (direction[i]) { is_moving = true; break; }

            // Camera orientation calculation
            state->camera_angle.x += (mouse_position_delta.x*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);
            state->camera_angle.y += (mouse_position_delta.y*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);

            // Angle clamp
            if (state->camera_angle.y > RF_CAMERA_FIRST_PERSON_MIN_CLAMP * RF_DEG2RAD) {
                state->camera_angle.y = RF_CAMERA_FIRST_PERSON_MIN_CLAMP * RF_DEG2RAD;
            }
            else if (state->camera_angle.y < RF_CAMERA_FIRST_PERSON_MAX_CLAMP * RF_DEG2RAD) {
                state->camera_angle.y = RF_CAMERA_FIRST_PERSON_MAX_CLAMP * RF_DEG2RAD;
            }

            // Camera is always looking at player
            camera->target.x = camera->position.x - sinf(state->camera_angle.x) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;
            camera->target.y = camera->position.y + sinf(state->camera_angle.y) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;
            camera->target.z = camera->position.z - cosf(state->camera_angle.x) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;

            if (is_moving) {
                state->swing_counter++;
            }

            // Camera position update
            // NOTE: On RF_CAMERA_FIRST_PERSON player Y-movement is limited to player 'eyes position'
            camera->position.y = state->player_eyes_position - sinf(state->swing_counter / RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER) / RF_CAMERA_FIRST_PERSON_STEP_DIVIDER;

            camera->up.x = sinf(state->swing_counter/(RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER * 2)) / RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER;
            camera->up.z = -sinf(state->swing_counter/(RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER * 2)) / RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER;

        } break;

        case RF_CAMERA_THIRD_PERSON:
        {
            camera->position.x += (sinf(state->camera_angle.x)*direction[rf_move_back] -
                                   sinf(state->camera_angle.x)*direction[rf_move_front] -
                                   cosf(state->camera_angle.x)*direction[rf_move_left] +
                                   cosf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.y += (sinf(state->camera_angle.y)*direction[rf_move_front] -
                                   sinf(state->camera_angle.y)*direction[rf_move_back] +
                                   1.0f*direction[rf_move_up] - 1.0f*direction[rf_move_down]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.z += (cosf(state->camera_angle.x)*direction[rf_move_back] -
                                   cosf(state->camera_angle.x)*direction[rf_move_front] +
                                   sinf(state->camera_angle.x)*direction[rf_move_left] -
                                   sinf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            // Camera orientation calculation
            state->camera_angle.x += (mouse_position_delta.x*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);
            state->camera_angle.y += (mouse_position_delta.y*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);

            // Angle clamp
            if (state->camera_angle.y > RF_CAMERA_THIRD_PERSON_MIN_CLAMP * RF_DEG2RAD)
            {
                state->camera_angle.y = RF_CAMERA_THIRD_PERSON_MIN_CLAMP * RF_DEG2RAD;
            }
            else if (state->camera_angle.y < RF_CAMERA_THIRD_PERSON_MAX_CLAMP * RF_DEG2RAD)
            {
                state->camera_angle.y = RF_CAMERA_THIRD_PERSON_MAX_CLAMP * RF_DEG2RAD;
            }

            // Camera zoom
            state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);

            // Camera distance clamp
            if (state->camera_target_distance < RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP)
            {
                state->camera_target_distance = RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP;
            }

            // TODO: It seems camera->position is not correctly updated or some rounding issue makes the camera move straight to camera->target...
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;

            if (state->camera_angle.y <= 0.0f)
            {
                camera->position.y = sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            }
            else
            {
                camera->position.y = -sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            }

            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        default: break;
    }
}